

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::addHandler
          (PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *this,
          function<void_(const_QList<QByteArray>_&)> *handler)

{
  QWriteLocker lock;
  QWriteLocker local_50;
  QThread *local_48;
  pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_> local_40;
  
  local_50.q_val = (quintptr)&this->m_lock;
  QWriteLocker::relock(&local_50);
  local_48 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>::
  pair<QThread_*,_std::function<void_(const_QList<QByteArray>_&)>,_true>
            (&local_40,&local_48,handler);
  QList<std::pair<QPointer<QThread>,std::function<void(QList<QByteArray>const&)>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void(QList<QByteArray>const&)>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void(QList<QByteArray>const&)>>> *)
             &this->m_handlers,&local_40);
  std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>::~pair(&local_40);
  QWriteLocker::~QWriteLocker(&local_50);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }